

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

uint32 leaf_mixw_occ(dtree_node_t *node,pset_t *pset,float32 ****mixw_occ,uint32 *node_id,
                    uint32 n_state,uint32 n_stream,uint32 n_density,uint32 off)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (; (node->y != (dtree_node_t *)0x0 || (node->n != (dtree_node_str *)0x0)); node = node->n) {
    off = leaf_mixw_occ(node->y,pset,mixw_occ,node_id,n_state,n_stream,n_density,off);
  }
  node_id[off] = node->node_id;
  for (uVar1 = 0; uVar1 != n_state; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; uVar2 != n_stream; uVar2 = uVar2 + 1) {
      for (uVar3 = 0; n_density != uVar3; uVar3 = uVar3 + 1) {
        mixw_occ[off][uVar1][uVar2][uVar3] = node->mixw_occ[uVar1][uVar2][uVar3];
      }
    }
  }
  return off + 1;
}

Assistant:

uint32
leaf_mixw_occ(dtree_node_t *node,
	      pset_t *pset,
	      float32 ****mixw_occ,
	      uint32 *node_id,
	      uint32 n_state,
	      uint32 n_stream,
	      uint32 n_density,
	      uint32 off)
{
    uint32 i, j, k;

    if (IS_LEAF(node)) {
	node_id[off] = node->node_id;

	for (i = 0; i < n_state; i++) {
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    mixw_occ[off][i][j][k] = node->mixw_occ[i][j][k];
		}
	    }
	}

	return ++off;
    }
    else {
	off = leaf_mixw_occ(node->y,
			pset,
			mixw_occ,
			node_id,
			n_state,
			n_stream,
			n_density,
			off);
	off = leaf_mixw_occ(node->n,
			pset,
			mixw_occ,
			node_id,
			n_state,
			n_stream,
			n_density,
			off);
	return off;
    }
}